

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void SetLastParsedLabel(char *label)

{
  aint aVar1;
  
  if (LastParsedLabel != (char *)0x0) {
    free(LastParsedLabel);
  }
  if (label == (char *)0x0) {
    LastParsedLabel = (char *)0x0;
    aVar1 = 0;
  }
  else {
    LastParsedLabel = strdup(label);
    aVar1 = CompiledCurrentLine;
    if (LastParsedLabel == (char *)0x0) {
      ErrorOOM();
      aVar1 = CompiledCurrentLine;
    }
  }
  LastParsedLabelLine = aVar1;
  return;
}

Assistant:

void SetLastParsedLabel(const char* label) {
	if (LastParsedLabel) free(LastParsedLabel);
	if (nullptr != label) {
		LastParsedLabel = STRDUP(label);
		if (nullptr == LastParsedLabel) ErrorOOM();
		LastParsedLabelLine = CompiledCurrentLine;
	} else {
		LastParsedLabel = nullptr;
		LastParsedLabelLine = 0;
	}
}